

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O1

void SBarInfo::Load(void)

{
  int iVar1;
  SBarInfo *pSVar2;
  int lastlump;
  int local_2c;
  
  FreeSBarInfoScript();
  if (MugShotStates.Count != 0) {
    TArray<FMugShotState,_FMugShotState>::DoDelete(&MugShotStates,0,MugShotStates.Count - 1);
    MugShotStates.Count = 0;
  }
  if (*(int *)(gameinfo.statusbar.Chars + -0xc) != 0) {
    iVar1 = FWadCollection::CheckNumForFullName(&Wads,gameinfo.statusbar.Chars,true,0);
    if (iVar1 != -1) {
      if (batchrun == false) {
        Printf("ParseSBarInfo: Loading default status bar definition.\n");
      }
      if (SBarInfoScript[1] == (SBarInfo *)0x0) {
        pSVar2 = (SBarInfo *)operator_new(0x160);
        SBarInfo(pSVar2,iVar1);
        SBarInfoScript[1] = pSVar2;
      }
      else {
        ParseSBarInfo(SBarInfoScript[1],iVar1);
      }
    }
  }
  iVar1 = FWadCollection::CheckNumForName(&Wads,"SBARINFO",0);
  if (iVar1 != -1) {
    if (batchrun == false) {
      Printf("ParseSBarInfo: Loading custom status bar definition.\n");
    }
    local_2c = 0;
    iVar1 = FWadCollection::FindLump(&Wads,"SBARINFO",&local_2c,false);
    if (iVar1 != -1) {
      do {
        if (SBarInfoScript[0] == (SBarInfo *)0x0) {
          pSVar2 = (SBarInfo *)operator_new(0x160);
          SBarInfo(pSVar2,iVar1);
          SBarInfoScript[0] = pSVar2;
        }
        else {
          ParseSBarInfo(SBarInfoScript[0],iVar1);
        }
        iVar1 = FWadCollection::FindLump(&Wads,"SBARINFO",&local_2c,false);
      } while (iVar1 != -1);
    }
  }
  addterm(FreeSBarInfoScript,"FreeSBarInfoScript");
  return;
}

Assistant:

void SBarInfo::Load()
{
	FreeSBarInfoScript();
	MugShotStates.Clear();
	if(gameinfo.statusbar.IsNotEmpty())
	{
		int lump = Wads.CheckNumForFullName(gameinfo.statusbar, true);
		if(lump != -1)
		{
			if (!batchrun) Printf ("ParseSBarInfo: Loading default status bar definition.\n");
			if(SBarInfoScript[SCRIPT_DEFAULT] == NULL)
				SBarInfoScript[SCRIPT_DEFAULT] = new SBarInfo(lump);
			else
				SBarInfoScript[SCRIPT_DEFAULT]->ParseSBarInfo(lump);
		}
	}

	if(Wads.CheckNumForName("SBARINFO") != -1)
	{
		if (!batchrun) Printf ("ParseSBarInfo: Loading custom status bar definition.\n");
		int lastlump, lump;
		lastlump = 0;
		while((lump = Wads.FindLump("SBARINFO", &lastlump)) != -1)
		{
			if(SBarInfoScript[SCRIPT_CUSTOM] == NULL)
				SBarInfoScript[SCRIPT_CUSTOM] = new SBarInfo(lump);
			else //We now have to load multiple SBarInfo Lumps so the 2nd time we need to use this method instead.
				SBarInfoScript[SCRIPT_CUSTOM]->ParseSBarInfo(lump);
		}
	}
	atterm(FreeSBarInfoScript);
}